

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_morph.cpp
# Opt level: O1

bool __thiscall ON_Mesh::EvaluatePoint(ON_Mesh *this,ON_ObjRef *objref,ON_3dPoint *P)

{
  TYPE TVar1;
  uint tope_index;
  int iVar2;
  int iVar3;
  ON_MeshTopologyVertex *pOVar4;
  int *piVar5;
  double dVar6;
  bool bVar7;
  ulong uVar8;
  ON_MeshFace *pOVar9;
  ON_Line L;
  ON_3dPoint local_140;
  ON_Line local_128;
  ON_3dPoint local_f8;
  ON_3dPoint local_e0;
  ON_3dPoint local_c0;
  ON_3dPoint local_a8;
  ON_3dPoint local_90;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  P->z = ON_3dPoint::UnsetPoint.z;
  dVar6 = ON_3dPoint::UnsetPoint.y;
  P->x = ON_3dPoint::UnsetPoint.x;
  P->y = dVar6;
  TVar1 = (objref->m_component_index).m_type;
  if (3 < TVar1 - mesh_vertex) goto LAB_005404ab;
  tope_index = (objref->m_component_index).m_index;
  uVar8 = (ulong)tope_index;
  switch(TVar1) {
  case mesh_vertex:
    if (((int)tope_index < 0) ||
       ((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count <= (int)tope_index)) goto LAB_005404ab;
    break;
  case meshtop_vertex:
    if (((int)tope_index < 0) || ((this->m_top).m_topv.m_count <= (int)tope_index))
    goto LAB_005404ab;
    pOVar4 = (this->m_top).m_topv.m_a;
    if ((pOVar4[uVar8].m_v_count < 1) || (piVar5 = pOVar4[uVar8].m_vi, piVar5 == (int *)0x0))
    goto LAB_005404ab;
    iVar2 = *piVar5;
    uVar8 = (ulong)iVar2;
    if (((long)uVar8 < 0) || ((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count <= iVar2))
    goto LAB_005404ab;
    break;
  case meshtop_edge:
    if (((objref->m_evp).m_t_type == 5) &&
       (ABS((objref->m_evp).m_t[0] + (objref->m_evp).m_t[1] + -1.0) <= 1.490116119385e-08)) {
      ON_MeshTopology::TopEdgeLine(&local_128,&this->m_top,tope_index);
      bVar7 = ON_Line::IsValid(&local_128);
      if (bVar7) {
        ON_Line::PointAt(&local_140,&local_128,(objref->m_evp).m_t[0]);
        P->z = local_140.z;
        P->x = local_140.x;
        P->y = local_140.y;
      }
      ON_Line::~ON_Line(&local_128);
    }
    goto LAB_005404ab;
  case mesh_face:
    if (((((objref->m_evp).m_t_type == 4) &&
         (ABS((objref->m_evp).m_t[0] + (objref->m_evp).m_t[1] + (objref->m_evp).m_t[2] +
              (objref->m_evp).m_t[3] + -1.0) <= 1.490116119385e-08)) && (-1 < (int)tope_index)) &&
       ((int)tope_index < (this->m_F).m_count)) {
      pOVar9 = (this->m_F).m_a;
      iVar2 = pOVar9[uVar8].vi[0];
      if (((-1 < iVar2) &&
          (iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, iVar2 < iVar3)) &&
         ((pOVar9 = pOVar9 + uVar8, pOVar9->vi[1] < iVar3 && -1 < pOVar9->vi[1] &&
          ((pOVar9->vi[2] < iVar3 && -1 < pOVar9->vi[2] &&
           (pOVar9->vi[3] < iVar3 && -1 < pOVar9->vi[3])))))) {
        ON_3dPoint::operator=
                  (&local_128.from,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar9->vi[0])
        ;
        ON_3dPoint::operator=
                  (&local_128.to,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar9->vi[1]);
        ON_3dPoint::operator=
                  (&local_f8,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar9->vi[2]);
        ON_3dPoint::operator=
                  (&local_e0,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + pOVar9->vi[3]);
        ::operator*(&local_78,(objref->m_evp).m_t[0],&local_128.from);
        ::operator*(&local_90,(objref->m_evp).m_t[1],&local_128.to);
        ON_3dPoint::operator+(&local_60,&local_78,&local_90);
        ::operator*(&local_a8,(objref->m_evp).m_t[2],&local_f8);
        ON_3dPoint::operator+(&local_48,&local_60,&local_a8);
        ::operator*(&local_c0,(objref->m_evp).m_t[3],&local_e0);
        ON_3dPoint::operator+(&local_140,&local_48,&local_c0);
        P->z = local_140.z;
        P->x = local_140.x;
        P->y = local_140.y;
      }
    }
    goto LAB_005404ab;
  }
  ON_3dPoint::operator=(P,(this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a + uVar8);
LAB_005404ab:
  bVar7 = ON_3dPoint::IsValid(P);
  return bVar7;
}

Assistant:

bool ON_Mesh::EvaluatePoint( const class ON_ObjRef& objref, ON_3dPoint& P ) const
{
  // virtual function default
  P = ON_3dPoint::UnsetPoint;
  ON_COMPONENT_INDEX ci = objref.m_component_index;

  switch ( ci.m_type )
  {
  case ON_COMPONENT_INDEX::mesh_vertex:
    if ( ci.m_index >= 0 && ci.m_index < m_V.Count() )
      P = m_V[ci.m_index];
    break;

  case ON_COMPONENT_INDEX::meshtop_vertex:
    if ( ci.m_index >= 0 && ci.m_index < m_top.m_topv.Count() )
    {
      const ON_MeshTopologyVertex& topv = m_top.m_topv[ci.m_index];
      if ( topv.m_v_count > 0 && topv.m_vi )
      {
        int vi = topv.m_vi[0];
        if ( vi >= 0 && vi < m_V.Count() )
          P = m_V[vi];
      }
    }
    break;

  case ON_COMPONENT_INDEX::meshtop_edge:
    if ( 5 == objref.m_evp.m_t_type 
         && fabs(objref.m_evp.m_t[0] + objref.m_evp.m_t[1] - 1.0) <= ON_SQRT_EPSILON )
    {
      ON_Line L = m_top.TopEdgeLine(ci.m_index);
      if ( L.IsValid() )
      {
        P = L.PointAt(objref.m_evp.m_t[0]);
      }
    }
    break;

  case ON_COMPONENT_INDEX::mesh_face:
    if ( 4 == objref.m_evp.m_t_type 
         && fabs(objref.m_evp.m_t[0] + objref.m_evp.m_t[1] + objref.m_evp.m_t[2] + objref.m_evp.m_t[3] - 1.0) <= ON_SQRT_EPSILON )
    {
      if ( ci.m_index >= 0 && ci.m_index < m_F.Count() )
      {
        const int* fvi = m_F[ci.m_index].vi;
        if ( fvi[0] < 0 || fvi[0] >= m_V.Count() )
          break;
        if ( fvi[1] < 0 || fvi[1] >= m_V.Count() )
          break;
        if ( fvi[2] < 0 || fvi[2] >= m_V.Count() )
          break;
        if ( fvi[3] < 0 || fvi[3] >= m_V.Count() )
          break;
        ON_3dPoint V[4];
        V[0] = m_V[fvi[0]];
        V[1] = m_V[fvi[1]];
        V[2] = m_V[fvi[2]];
        V[3] = m_V[fvi[3]];
        P = objref.m_evp.m_t[0]*V[0] + objref.m_evp.m_t[1]*V[1] + objref.m_evp.m_t[2]*V[2] + objref.m_evp.m_t[3]*V[3];
      }
    }
    break;

  default:
    // intentionally skipping other ON_COMPONENT_INDEX::TYPE enum values
    break;
  }

  return P.IsValid();
}